

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_RegExpExec(JSContext *ctx,JSValue r,JSValue s)

{
  JSValue v;
  JSValue v_00;
  JSValue this_obj;
  JSValue func_obj;
  int iVar1;
  int64_t in_RCX;
  JSValueUnion in_RDI;
  JSValue JVar2;
  JSValue ret;
  JSValue method;
  JSAtom in_stack_0000009c;
  JSContext *in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  undefined1 in_stack_000000b8 [16];
  JSValue *in_stack_000000e0;
  int in_stack_000000ec;
  JSContext *in_stack_000000f0;
  undefined1 in_stack_000000f8 [16];
  BOOL in_stack_00000140;
  JSContext *in_stack_ffffffffffffff50;
  JSValue in_stack_ffffffffffffff58;
  undefined4 local_88;
  int in_stack_ffffffffffffff7c;
  undefined4 uVar3;
  JSContext *in_stack_ffffffffffffff80;
  JSValue local_40;
  int64_t iStack_38;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar2 = JS_GetPropertyInternal
                    (in_stack_000000a0,(JSValue)in_stack_000000b8,in_stack_0000009c,
                     (JSValue)in_stack_000000a8,in_stack_00000140);
  local_10 = JVar2.u;
  local_8 = JVar2.tag;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    JVar2.tag = local_8;
    JVar2.u.ptr = local_10.ptr;
    iVar1 = JS_IsFunction((JSContext *)in_RDI.ptr,JVar2);
    if (iVar1 == 0) {
      JS_FreeValue(in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
      local_40 = js_regexp_exec(in_stack_000000f0,(JSValue)in_stack_000000f8,in_stack_000000ec,
                                in_stack_000000e0);
    }
    else {
      func_obj.tag = in_RCX;
      func_obj.u.ptr = in_RDI.ptr;
      this_obj.tag = local_8;
      this_obj.u.ptr = local_10.ptr;
      JVar2 = JS_CallFree(in_stack_ffffffffffffff80,func_obj,this_obj,in_stack_ffffffffffffff7c,
                          (JSValue *)local_40.u.ptr);
      local_88 = JVar2.u._0_4_;
      uVar3 = JVar2.u._4_4_;
      iStack_38 = JVar2.tag;
      iVar1 = JS_IsException(JVar2);
      if (iVar1 == 0) {
        v.u._4_4_ = uVar3;
        v.u.int32 = local_88;
        v.tag = iStack_38;
        iVar1 = JS_IsObject(v);
        if ((iVar1 == 0) &&
           (v_00.u._4_4_ = uVar3, v_00.u.int32 = local_88, v_00.tag = iStack_38,
           iVar1 = JS_IsNull(v_00), iVar1 == 0)) {
          JS_FreeValue(in_stack_ffffffffffffff50,JVar2);
          JVar2 = JS_ThrowTypeError((JSContext *)in_RDI.ptr,
                                    "RegExp exec method must return an object or null");
          return JVar2;
        }
        local_40.u._4_4_ = uVar3;
        local_40.u.int32 = local_88;
      }
      else {
        local_40.u._4_4_ = uVar3;
        local_40.u.int32 = local_88;
      }
    }
  }
  else {
    iStack_38 = local_8;
    local_40.u.ptr = local_10.ptr;
  }
  return local_40;
}

Assistant:

static JSValue JS_RegExpExec(JSContext *ctx, JSValueConst r, JSValueConst s)
{
    JSValue method, ret;

    method = JS_GetProperty(ctx, r, JS_ATOM_exec);
    if (JS_IsException(method))
        return method;
    if (JS_IsFunction(ctx, method)) {
        ret = JS_CallFree(ctx, method, r, 1, &s);
        if (JS_IsException(ret))
            return ret;
        if (!JS_IsObject(ret) && !JS_IsNull(ret)) {
            JS_FreeValue(ctx, ret);
            return JS_ThrowTypeError(ctx, "RegExp exec method must return an object or null");
        }
        return ret;
    }
    JS_FreeValue(ctx, method);
    return js_regexp_exec(ctx, r, 1, &s);
}